

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

int av1_apply_selfguided_restoration_c
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  ulong uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ushort *puVar7;
  ushort *puVar8;
  undefined2 uVar9;
  uint uVar10;
  undefined2 *puVar11;
  undefined2 *puVar12;
  int32_t *flt1;
  uint8_t *local_78;
  int xq [2];
  
  flt1 = tmpbuf + 0x27734;
  av1_selfguided_restoration_c(dat8,width,height,stride,tmpbuf,flt1,width,eps,bit_depth,highbd);
  av1_decode_xq(xqd,xq,av1_sgr_params + eps);
  uVar1 = 0;
  if (0 < width) {
    uVar1 = (ulong)(uint)width;
  }
  if (height < 1) {
    height = 0;
  }
  puVar7 = (ushort *)((long)dat8 * 2);
  puVar11 = (undefined2 *)((long)dst8 * 2);
  local_78 = dat8;
  for (uVar6 = 0; uVar6 != (uint)height; uVar6 = uVar6 + 1) {
    puVar8 = puVar7;
    puVar12 = puVar11;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      if (highbd == 0) {
        uVar2 = (ushort)local_78[uVar5];
      }
      else {
        uVar2 = *puVar8;
      }
      iVar3 = (uint)uVar2 * 0x800;
      if (0 < av1_sgr_params[eps].r[0]) {
        iVar3 = iVar3 + (flt1[uVar5 - 0x27734] + (uint)uVar2 * -0x10) * xq[0];
      }
      if (0 < av1_sgr_params[eps].r[1]) {
        iVar3 = iVar3 + (flt1[uVar5] + (uint)uVar2 * -0x10) * xq[1];
      }
      uVar4 = iVar3 * 0x20 + 0x8000 >> 0x10;
      uVar10 = uVar4;
      if (bit_depth == 10) {
        if (0x3fe < uVar4) {
          uVar10 = 0x3ff;
        }
      }
      else if (bit_depth == 0xc) {
        if (0xffe < uVar4) {
          uVar10 = 0xfff;
        }
      }
      else if (0xfe < uVar4) {
        uVar10 = 0xff;
      }
      uVar9 = (undefined2)uVar10;
      if ((int)uVar4 < 0) {
        uVar9 = 0;
      }
      if (highbd == 0) {
        dst8[uVar5] = (uint8_t)uVar9;
      }
      else {
        *puVar12 = uVar9;
      }
      puVar8 = puVar8 + 1;
      puVar12 = puVar12 + 1;
    }
    puVar7 = puVar7 + stride;
    local_78 = local_78 + stride;
    puVar11 = puVar11 + dst_stride;
    dst8 = dst8 + dst_stride;
    flt1 = flt1 + width;
  }
  return 0;
}

Assistant:

int av1_apply_selfguided_restoration_c(const uint8_t *dat8, int width,
                                       int height, int stride, int eps,
                                       const int *xqd, uint8_t *dst8,
                                       int dst_stride, int32_t *tmpbuf,
                                       int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);

  const int ret = av1_selfguided_restoration_c(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);
  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; ++j) {
      const int k = i * width + j;
      uint8_t *dst8ij = dst8 + i * dst_stride + j;
      const uint8_t *dat8ij = dat8 + i * stride + j;

      const uint16_t pre_u = highbd ? *CONVERT_TO_SHORTPTR(dat8ij) : *dat8ij;
      const int32_t u = (int32_t)pre_u << SGRPROJ_RST_BITS;
      int32_t v = u << SGRPROJ_PRJ_BITS;
      // If params->r == 0 then we skipped the filtering in
      // av1_selfguided_restoration_c, i.e. flt[k] == u
      if (params->r[0] > 0) v += xq[0] * (flt0[k] - u);
      if (params->r[1] > 0) v += xq[1] * (flt1[k] - u);
      const int16_t w =
          (int16_t)ROUND_POWER_OF_TWO(v, SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      const uint16_t out = clip_pixel_highbd(w, bit_depth);
      if (highbd)
        *CONVERT_TO_SHORTPTR(dst8ij) = out;
      else
        *dst8ij = (uint8_t)out;
    }
  }
  return 0;
}